

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CUSERCommand::doWhat(CUSERCommand *this,CClient *pClient)

{
  bool bVar1;
  __type _Var2;
  ArrayIndex AVar3;
  ulong uVar4;
  string *document;
  Value *pVVar5;
  ostream *this_00;
  allocator local_1d1;
  undefined1 local_1d0 [8];
  string ret;
  string name;
  undefined1 local_188 [4];
  int i;
  Value user;
  undefined1 local_150 [8];
  Reader reader;
  Value value;
  CClient *pClient_local;
  CUSERCommand *this_local;
  
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    Json::Value::Value((Value *)&reader.features_,nullValue);
    Json::Reader::Reader((Reader *)local_150);
    document = CCommand::GetUserInfo_abi_cxx11_();
    bVar1 = Json::Reader::parse((Reader *)local_150,document,(Value *)&reader.features_,true);
    if (!bVar1) {
      this_00 = std::operator<<((ostream *)&std::cout,"Load user info error,now exit.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    pVVar5 = Json::Value::operator[]((Value *)&reader.features_,"user");
    Json::Value::Value((Value *)local_188,pVVar5);
    for (name.field_2._12_4_ = 0; AVar3 = Json::Value::size((Value *)local_188),
        (uint)name.field_2._12_4_ < AVar3; name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      pVVar5 = Json::Value::operator[]((Value *)local_188,name.field_2._12_4_);
      pVVar5 = Json::Value::operator[](pVVar5,"name");
      Json::Value::asString_abi_cxx11_((string *)((long)&ret.field_2 + 8),pVVar5);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&ret.field_2 + 8),&(this->super_CCommand).m_Args);
      if (_Var2) {
        CClient::SetClientName(pClient,(string *)((long)&ret.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)(ret.field_2._M_local_buf + 8));
    }
    Json::Value::~Value((Value *)local_188);
    Json::Reader::~Reader((Reader *)local_150);
    Json::Value::~Value((Value *)&reader.features_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1d0,"331 Please specify the password.\r\n",&local_1d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  CClient::sendMsg(pClient,(string *)local_1d0);
  CClient::SetClientState(pClient,USER);
  std::__cxx11::string::~string((string *)local_1d0);
  return 1;
}

Assistant:

int CUSERCommand::doWhat(CClient *pClient) {
    if(!m_Args.empty()){
        Json::Value value;
        Json::Reader reader;
        if(reader.parse(CCommand::GetUserInfo(),value)){
            Json::Value user = value["user"];
            for(int i = 0;i < user.size();i++){
                string name = user[i]["name"].asString();
                if(name == m_Args){
                    pClient->SetClientName(name);
                }
            }
        }
        else{
            cout << "Load user info error,now exit." << endl;
            exit(-1);
        }
    }
    string ret = "331 Please specify the password.\r\n";
    pClient->sendMsg(ret);
    pClient->SetClientState(USER);
    return 1;
}